

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  uint64_t h;
  uint64_t m;
  uint64_t s;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  s = (uint64_t)argv;
  argv_local._0_4_ = argc;
  printf("Enter an amount of seconds: ");
  __isoc99_scanf("%lu",&m);
  uVar1 = m / 0x3c;
  m = m % 0x3c;
  printf("This is equal to %lu hours, %lu minutes and %lu seconds\n",uVar1 / 0x3c,uVar1 % 0x3c,m);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  uint64_t s;
  printf("Enter an amount of seconds: ");
  scanf("%" SCNu64, &s);
  // If s was an `int`, you could've written:
  // scanf("%d", &s);

  uint64_t m = s / 60;
  s %= 60;

  uint64_t h = m / 60;
  m %= 60;

  printf("This is equal to %" PRIu64 " hours, %" PRIu64 " minutes and %" PRIu64 " seconds\n", h, m, s);
  // If s, m and h were `int`s, you could've written:
  // printf("This is equal to %d hours, %d minutes and %d seconds\n", h, m, s);

  return 0;
}